

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O1

string * __thiscall
cfd::core::ScriptOperator::ToString_abi_cxx11_(string *__return_storage_ptr__,ScriptOperator *this)

{
  size_type sVar1;
  pointer pcVar2;
  long lVar3;
  long lVar4;
  
  while( true ) {
    sVar1 = (this->text_data_)._M_string_length;
    if (sVar1 != 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar2 = (this->text_data_)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar2,pcVar2 + sVar1);
      return __return_storage_ptr__;
    }
    if (g_operator_map._40_8_ == 0) break;
    lVar3 = 0x6ce198;
    if (g_operator_map._16_8_ != 0) {
      lVar3 = 0x6ce198;
      lVar4 = g_operator_map._16_8_;
      do {
        if ((int)this->data_type_ <= *(int *)(lVar4 + 0x20)) {
          lVar3 = lVar4;
        }
        lVar4 = *(long *)(lVar4 + 0x10 + (ulong)(*(int *)(lVar4 + 0x20) < (int)this->data_type_) * 8
                         );
      } while (lVar4 != 0);
    }
    lVar4 = 0x6ce198;
    if ((lVar3 != 0x6ce198) && (lVar4 = lVar3, (int)this->data_type_ < *(int *)(lVar3 + 0x20))) {
      lVar4 = 0x6ce198;
    }
    if (lVar4 == 0x6ce198) break;
    this = (ScriptOperator *)(lVar4 + 0x28);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"UNKNOWN","");
  return __return_storage_ptr__;
}

Assistant:

std::string ScriptOperator::ToString() const {
  if (text_data_.empty()) {
    if (!g_operator_map.empty()) {
      decltype(g_operator_map)::const_iterator ite =
          g_operator_map.find(data_type_);
      if (ite != g_operator_map.end()) {
        return ite->second.ToString();
      }
    }
    return "UNKNOWN";
  }
  return text_data_;
}